

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_batch.c
# Opt level: O1

int process_alignctl_line(ps_decoder_t *ps,cmd_ln_t *config,char *fname)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  FILE *__stream;
  size_t __n;
  size_t sVar5;
  char *pcVar6;
  long ln;
  
  pcVar3 = ps_config_str(config,"aligndir");
  pcVar4 = ps_config_str(config,"alignext");
  if (fname == (char *)0x0) {
    return 0;
  }
  if (pcVar3 == (char *)0x0) {
    if (pcVar4 == (char *)0x0) {
      pcVar3 = __ckd_salloc__(fname,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                              ,0x16a);
    }
    else {
      pcVar3 = string_join(fname,pcVar4,0);
    }
  }
  else {
    pcVar6 = "";
    if (pcVar4 != (char *)0x0) {
      pcVar6 = pcVar4;
    }
    pcVar3 = string_join(pcVar3,"/",fname,pcVar6,0);
  }
  __stream = fopen(pcVar3,"r");
  if (__stream == (FILE *)0x0) {
    pcVar6 = "Failed to open transcript file %s";
    pcVar4 = (char *)0x0;
    ln = 0x16d;
  }
  else {
    fseek(__stream,0,2);
    __n = ftell(__stream);
    pcVar4 = (char *)__ckd_calloc__(__n + 1,1,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                                    ,0x173);
    fseek(__stream,0,0);
    sVar5 = fread(pcVar4,1,__n,__stream);
    if (sVar5 == __n) {
      iVar1 = fclose(__stream);
      if (iVar1 == 0) {
        iVar2 = ps_set_align_text(ps,pcVar4);
        iVar1 = -1;
        if (iVar2 == 0) {
          iVar1 = 0;
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                  ,0x182,"Force-aligning with transcript from: %s\n",fname);
        }
      }
      else {
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                       ,0x17b,"Failed to close transcript file %s",pcVar3);
      }
      goto LAB_00108627;
    }
    pcVar6 = "Failed to fully read transcript file %s";
    ln = 0x176;
  }
  err_msg_system(ERR_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                 ,ln,pcVar6,pcVar3);
  iVar1 = -1;
LAB_00108627:
  ckd_free(pcVar3);
  ckd_free(pcVar4);
  return iVar1;
}

Assistant:

static int
process_alignctl_line(ps_decoder_t *ps, cmd_ln_t *config, char const *fname)
{
    int err;
    char *path = NULL;
    const char *aligndir = ps_config_str(config, "aligndir");
    const char *alignext = ps_config_str(config, "alignext");
    char *text = NULL;
    size_t nchars, nread;
    FILE *fh;

    if (fname == NULL)
        return 0;

    if (aligndir)
        path = string_join(aligndir, "/", fname, alignext ? alignext : "", NULL);
    else if (alignext)
        path = string_join(fname, alignext, NULL);
    else
        path = ckd_salloc(fname);

    if ((fh = fopen(path, "r")) == NULL) {
        E_ERROR_SYSTEM("Failed to open transcript file %s", path);
        err = -1;
        goto error_out;
    }
    fseek(fh, 0, SEEK_END);
    nchars = ftell(fh);
    text = ckd_calloc(nchars + 1, 1);
    fseek(fh, 0, SEEK_SET);
    if ((nread = fread(text, 1, nchars, fh)) != nchars) {
        E_ERROR_SYSTEM("Failed to fully read transcript file %s", path);
        err = -1;
        goto error_out;
    }
    if ((err = fclose(fh)) != 0) {
        E_ERROR_SYSTEM("Failed to close transcript file %s", path);
        goto error_out;
    }
    if (ps_set_align_text(ps, text)) {
        err = -1;
        goto error_out;
    }
    E_INFO("Force-aligning with transcript from: %s\n", fname);

error_out:
    ckd_free(path);
    ckd_free(text);

    return err;
}